

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.h
# Opt level: O0

text_style * __thiscall fmt::v5::text_style::operator|=(text_style *this,text_style *rhs)

{
  format_error *this_00;
  char *message;
  color_type *in_RSI;
  text_style *in_RDI;
  char *in_stack_ffffffffffffffc8;
  format_error *in_stack_ffffffffffffffd0;
  
  if ((in_RDI->set_foreground_color & 1U) == 0) {
    in_RDI->set_foreground_color = (bool)(in_RSI[2].is_rgb & 1);
    in_RDI->foreground_color = *in_RSI;
  }
  else if ((in_RSI[2].is_rgb & 1U) != 0) {
    if ((((in_RDI->foreground_color).is_rgb & 1U) == 0) || ((in_RSI->is_rgb & 1U) == 0)) {
      this_00 = (format_error *)__cxa_allocate_exception(0x10);
      format_error::format_error(this_00,in_stack_ffffffffffffffc8);
      __cxa_throw(this_00,&format_error::typeinfo,format_error::~format_error);
    }
    (in_RDI->foreground_color).value.rgb_color =
         (in_RSI->value).rgb_color | (in_RDI->foreground_color).value.rgb_color;
  }
  if ((in_RDI->set_background_color & 1U) == 0) {
    in_RDI->set_background_color = (bool)(in_RSI[2].field_0x1 & 1);
    in_RDI->background_color = in_RSI[1];
  }
  else if ((in_RSI[2].field_0x1 & 1) != 0) {
    if ((((in_RDI->background_color).is_rgb & 1U) == 0) || ((in_RSI[1].is_rgb & 1U) == 0)) {
      message = (char *)__cxa_allocate_exception(0x10);
      format_error::format_error(in_stack_ffffffffffffffd0,message);
      __cxa_throw(message,&format_error::typeinfo,format_error::~format_error);
    }
    (in_RDI->background_color).value.rgb_color =
         in_RSI[1].value.rgb_color | (in_RDI->background_color).value.rgb_color;
  }
  in_RDI->ems = in_RDI->ems | in_RSI[2].field_0x2;
  return in_RDI;
}

Assistant:

FMT_CONSTEXPR text_style &operator|=(const text_style &rhs) {
    if (!set_foreground_color) {
      set_foreground_color = rhs.set_foreground_color;
      foreground_color = rhs.foreground_color;
    } else if (rhs.set_foreground_color) {
      if (!foreground_color.is_rgb || !rhs.foreground_color.is_rgb)
        throw format_error("can't OR a terminal color");
      foreground_color.value.rgb_color |= rhs.foreground_color.value.rgb_color;
    }

    if (!set_background_color) {
      set_background_color = rhs.set_background_color;
      background_color = rhs.background_color;
    } else if (rhs.set_background_color) {
      if (!background_color.is_rgb || !rhs.background_color.is_rgb)
        throw format_error("can't OR a terminal color");
      background_color.value.rgb_color |= rhs.background_color.value.rgb_color;
    }

    ems = static_cast<emphasis>(static_cast<uint8_t>(ems) |
                                static_cast<uint8_t>(rhs.ems));
    return *this;
  }